

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  EasyCollector ecurl;
  
  curl::EasyCollector::EasyCollector(&ecurl);
  iVar1 = curl::Easy::perform_url((char *)&ecurl);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct((ulong)local_a0,'P');
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_a0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Result       : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Document size: ");
  curl::EasyCollector::document_abi_cxx11_();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Debug size   : ");
  curl::EasyCollector::debug_abi_cxx11_();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_a0);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct((ulong)local_a0,'P');
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_a0);
  poVar2 = std::operator<<(poVar2,"\n");
  psVar3 = (string *)curl::EasyCollector::document_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,psVar3);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct((ulong)local_80,'P');
  poVar2 = std::operator<<(poVar2,(string *)local_80);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_a0);
  curl::EasyCollector::~EasyCollector(&ecurl);
  return 0;
}

Assistant:

int main() {
    constexpr auto width = 80;
    curl::EasyCollector ecurl; // our curl object

    CURLcode res = ecurl.perform_url("https://lyncon.se/curl-Easy-cpp.txt");

    std::cout
        << std::string(width, '-') << "\n"
        << "Result       : " << res << "\n"
        << "Document size: " << ecurl.document().size() << "\n"
        << "Debug size   : " << ecurl.debug().size() << "\n";

    std::cout
        << std::string(width, '-') << "\n"
        << ecurl.document()                 // print the captured document
        << std::string(width, '-') << "\n";
}